

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O2

SPElement __thiscall
data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
dequeueMinN(PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this,
           size_t n)

{
  LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *this_00;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *_previous;
  size_t in_RDX;
  
  _checkN((PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)n,in_RDX);
  this_00 = (LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)(n + 8);
  if (in_RDX == 1) {
    this->_vptr_PriorityQueue = *(_func_int ***)(*(long *)(*(long *)(n + 0x10) + 8) + 0x10);
    LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::deleteFromHeader
              (this_00);
  }
  else {
    _previous = LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::getKthNode
                          (this_00,in_RDX - 1);
    this->_vptr_PriorityQueue = (_func_int **)_previous->_next->element;
    LinkedList<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::deleteAfterNode
              (this_00,_previous);
  }
  return (SPElement)this;
}

Assistant:

inline
    T PriorityQueue<T>::dequeueMinN(const size_t n) {
        _checkN(n);
        T result;
        if (n == 1) {
            result = _list.begin()->element;
            _list.deleteFromHeader();
        }
        else {
            auto node = _list.getKthNode(n - 1);
            result = node->next()->element;
            _list.deleteAfterNode(node);
        }
        return result;
    }